

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * allocate(uint n)

{
  char *local_18;
  char *p;
  uint n_local;
  
  local_18 = (char *)0x0;
  if ((n != 0) && (local_18 = (char *)calloc(1,(ulong)(n + 10)), local_18 == (char *)0x0)) {
    no_space();
  }
  return local_18;
}

Assistant:

char *allocate(unsigned n)
{
    register char *p;

    p = NULL;
    if (n)
    {
        /* VM: add a few bytes here, cause
         * Linux calloc does not like sizes like 32768 */
	p = CALLOC(1, n+10);
	if (!p) no_space();
    }
    return (p);
}